

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdFetchRelativeOffset
                   (INSTRUX *Instrux,ND_UINT8 *Code,ND_UINT8 Offset,ND_SIZET Size,
                   ND_UINT8 RelOffsetSize)

{
  NDSTATUS NVar1;
  ND_UINT64 NVar2;
  undefined3 in_register_00000011;
  undefined3 in_register_00000081;
  byte bVar3;
  
  NVar1 = 0x80000001;
  if ((ulong)CONCAT31(in_register_00000081,RelOffsetSize) +
      (ulong)CONCAT31(in_register_00000011,Offset) <= Size) {
    Instrux->field_0x7 = Instrux->field_0x7 | 2;
    *(ulong *)&Instrux->field_0xc =
         *(ulong *)&Instrux->field_0xc & 0xffffff0fffffffff | (ulong)(RelOffsetSize & 0xf) << 0x24;
    *(ushort *)&Instrux->field_0x14 =
         (ushort)*(undefined4 *)&Instrux->field_0x14 & 0xff0f | (ushort)(byte)(Offset << 4);
    NVar2 = NdFetchData(Code + CONCAT31(in_register_00000011,Offset),RelOffsetSize);
    (Instrux->field_74).Displacement = (ND_UINT32)NVar2;
    bVar3 = RelOffsetSize + Instrux->Length;
    Instrux->Length = bVar3;
    NVar1 = 0x80000003;
    if (bVar3 < 0x10) {
      NVar1 = 0;
    }
  }
  return NVar1;
}

Assistant:

static NDSTATUS
NdFetchRelativeOffset(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_UINT8 Offset,
    ND_SIZET Size,
    ND_UINT8 RelOffsetSize
    )
{
    // Make sure we don't outrun the buffer.
    RET_GT((ND_SIZET)Offset + RelOffsetSize, Size, ND_STATUS_BUFFER_TOO_SMALL);

    Instrux->HasRelOffs = ND_TRUE;
    Instrux->RelOffsLength = RelOffsetSize;
    Instrux->RelOffsOffset = Offset;

    Instrux->RelativeOffset = (ND_UINT32)NdFetchData(Code + Offset, RelOffsetSize);

    Instrux->Length += RelOffsetSize;
    if (Instrux->Length > ND_MAX_INSTRUCTION_LENGTH)
    {
        return ND_STATUS_INSTRUCTION_TOO_LONG;
    }

    return ND_STATUS_SUCCESS;
}